

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeSorterCompareInt
              (SortSubtask *pTask,int *pbKey2Cached,void *pKey1,int nKey1,void *pKey2,int nKey2)

{
  byte bVar1;
  byte bVar2;
  KeyInfo *pKVar3;
  int iVar4;
  int iVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  
  bVar1 = *(byte *)((long)pKey1 + 1);
  bVar2 = *(byte *)((long)pKey2 + 1);
  pbVar6 = (byte *)((ulong)*pKey1 + (long)pKey1);
  pbVar7 = (byte *)((ulong)*pKey2 + (long)pKey2);
  if (bVar1 == bVar2) {
    if (0xfffffffffffffff9 < (ulong)bVar1 - 7) {
      uVar8 = 0;
      do {
        if ((uint)pbVar6[uVar8] - (uint)pbVar7[uVar8] != 0) {
          iVar4 = (uint)pbVar6[uVar8] - (uint)pbVar7[uVar8];
          if ((char)(*pbVar7 ^ *pbVar6) < '\0') {
            iVar4 = (uint)(-1 < (char)*pbVar6) * 2 + -1;
          }
          goto LAB_0016956c;
        }
        uVar8 = uVar8 + 1;
      } while ((byte)(""[bVar1] + (""[bVar1] == '\0')) != uVar8);
    }
    iVar4 = 0;
  }
  else {
    iVar4 = (uint)bVar1 - (uint)bVar2;
    if (bVar1 < 8 || bVar2 < 8) {
      if (7 < bVar1) {
        iVar4 = -1;
      }
      if (7 < bVar2) {
        iVar4 = 1;
      }
      if (iVar4 < 1) {
        if ((char)*pbVar7 < '\0') {
          iVar4 = 1;
        }
      }
      else if ((char)*pbVar6 < '\0') {
        iVar4 = -1;
      }
    }
  }
LAB_0016956c:
  pKVar3 = pTask->pSorter->pKeyInfo;
  if (iVar4 == 0) {
    iVar5 = 0;
    if (1 < pKVar3->nKeyField) {
      iVar4 = vdbeSorterCompareTail(pTask,pbKey2Cached,pKey1,nKey1,pKey2,nKey2);
      return iVar4;
    }
  }
  else {
    iVar5 = -iVar4;
    if (*pKVar3->aSortFlags == '\0') {
      iVar5 = iVar4;
    }
  }
  return iVar5;
}

Assistant:

static int vdbeSorterCompareInt(
  SortSubtask *pTask,             /* Subtask context (for pKeyInfo) */
  int *pbKey2Cached,              /* True if pTask->pUnpacked is pKey2 */
  const void *pKey1, int nKey1,   /* Left side of comparison */
  const void *pKey2, int nKey2    /* Right side of comparison */
){
  const u8 * const p1 = (const u8 * const)pKey1;
  const u8 * const p2 = (const u8 * const)pKey2;
  const int s1 = p1[1];                 /* Left hand serial type */
  const int s2 = p2[1];                 /* Right hand serial type */
  const u8 * const v1 = &p1[ p1[0] ];   /* Pointer to value 1 */
  const u8 * const v2 = &p2[ p2[0] ];   /* Pointer to value 2 */
  int res;                              /* Return value */

  assert( (s1>0 && s1<7) || s1==8 || s1==9 );
  assert( (s2>0 && s2<7) || s2==8 || s2==9 );

  if( s1==s2 ){
    /* The two values have the same sign. Compare using memcmp(). */
    static const u8 aLen[] = {0, 1, 2, 3, 4, 6, 8, 0, 0, 0 };
    const u8 n = aLen[s1];
    int i;
    res = 0;
    for(i=0; i<n; i++){
      if( (res = v1[i] - v2[i])!=0 ){
        if( ((v1[0] ^ v2[0]) & 0x80)!=0 ){
          res = v1[0] & 0x80 ? -1 : +1;
        }
        break;
      }
    }
  }else if( s1>7 && s2>7 ){
    res = s1 - s2;
  }else{
    if( s2>7 ){
      res = +1;
    }else if( s1>7 ){
      res = -1;
    }else{
      res = s1 - s2;
    }
    assert( res!=0 );

    if( res>0 ){
      if( *v1 & 0x80 ) res = -1;
    }else{
      if( *v2 & 0x80 ) res = +1;
    }
  }

  if( res==0 ){
    if( pTask->pSorter->pKeyInfo->nKeyField>1 ){
      res = vdbeSorterCompareTail(
          pTask, pbKey2Cached, pKey1, nKey1, pKey2, nKey2
      );
    }
  }else if( pTask->pSorter->pKeyInfo->aSortFlags[0] ){
    assert( !(pTask->pSorter->pKeyInfo->aSortFlags[0]&KEYINFO_ORDER_BIGNULL) );
    res = res * -1;
  }

  return res;
}